

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LSMTree.cpp
# Opt level: O0

void __thiscall LSMTree::put(LSMTree *this,longlong key,string *s)

{
  size_t sVar1;
  MemTable *pMVar2;
  string local_40 [32];
  string *local_20;
  string *s_local;
  longlong key_local;
  LSMTree *this_local;
  
  pMVar2 = this->memory;
  local_20 = s;
  s_local = (string *)key;
  key_local = (longlong)this;
  std::__cxx11::string::string(local_40,(string *)s);
  (*(pMVar2->
    super_Dictionary<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    )._vptr_Dictionary[1])(pMVar2,key,local_40);
  std::__cxx11::string::~string(local_40);
  sVar1 = MemTable::size_bytes(this->memory);
  if ((ulong)(long)this->MEMTABLE_LIMIT < sVar1) {
    DiskTable::persistent(this->disk,this->memory,false);
    pMVar2 = (MemTable *)operator_new(0x30);
    MemTable::MemTable(pMVar2);
    this->memory = pMVar2;
  }
  return;
}

Assistant:

void LSMTree::put(long long key, const std::string &s) {
    memory->put(key, s);
    if (memory->size_bytes() > MEMTABLE_LIMIT) {
        disk->persistent(std::move(*memory));
        memory = new MemTable{};
    }
}